

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O0

void av1_get_block_dimensions
               (BLOCK_SIZE bsize,int plane,MACROBLOCKD *xd,int *width,int *height,
               int *rows_within_bounds,int *cols_within_bounds)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  bool local_5a;
  bool local_59;
  uint local_58;
  uint local_54;
  int is_chroma_sub8_y;
  int is_chroma_sub8_x;
  int plane_block_height;
  int plane_block_width;
  macroblockd_plane *pd;
  int block_cols;
  int block_rows;
  int block_width;
  int block_height;
  int *rows_within_bounds_local;
  int *height_local;
  int *width_local;
  MACROBLOCKD *xd_local;
  int plane_local;
  BLOCK_SIZE bsize_local;
  
  uVar1 = (uint)block_size_high[bsize];
  uVar2 = (uint)block_size_wide[bsize];
  local_54 = uVar1;
  if (xd->mb_to_bottom_edge < 0) {
    local_54 = (xd->mb_to_bottom_edge >> 3) + uVar1;
  }
  local_58 = uVar2;
  if (xd->mb_to_right_edge < 0) {
    local_58 = (xd->mb_to_right_edge >> 3) + uVar2;
  }
  iVar3 = (int)uVar2 >> ((byte)xd->plane[plane].subsampling_x & 0x1f);
  iVar4 = (int)uVar1 >> ((byte)xd->plane[plane].subsampling_y & 0x1f);
  local_59 = 0 < plane && iVar3 < 4;
  local_5a = 0 < plane && iVar4 < 4;
  if (width != (int *)0x0) {
    *width = iVar3 + (uint)local_59 * 2;
  }
  if (height != (int *)0x0) {
    *height = iVar4 + (uint)local_5a * 2;
  }
  if (rows_within_bounds != (int *)0x0) {
    *rows_within_bounds =
         ((int)local_54 >> ((byte)xd->plane[plane].subsampling_y & 0x1f)) + (uint)local_5a * 2;
  }
  if (cols_within_bounds != (int *)0x0) {
    *cols_within_bounds =
         ((int)local_58 >> ((byte)xd->plane[plane].subsampling_x & 0x1f)) + (uint)local_59 * 2;
  }
  return;
}

Assistant:

static inline void av1_get_block_dimensions(BLOCK_SIZE bsize, int plane,
                                            const MACROBLOCKD *xd, int *width,
                                            int *height,
                                            int *rows_within_bounds,
                                            int *cols_within_bounds) {
  const int block_height = block_size_high[bsize];
  const int block_width = block_size_wide[bsize];
  const int block_rows = (xd->mb_to_bottom_edge >= 0)
                             ? block_height
                             : (xd->mb_to_bottom_edge >> 3) + block_height;
  const int block_cols = (xd->mb_to_right_edge >= 0)
                             ? block_width
                             : (xd->mb_to_right_edge >> 3) + block_width;
  const struct macroblockd_plane *const pd = &xd->plane[plane];
  assert(IMPLIES(plane == PLANE_TYPE_Y, pd->subsampling_x == 0));
  assert(IMPLIES(plane == PLANE_TYPE_Y, pd->subsampling_y == 0));
  assert(block_width >= block_cols);
  assert(block_height >= block_rows);
  const int plane_block_width = block_width >> pd->subsampling_x;
  const int plane_block_height = block_height >> pd->subsampling_y;
  // Special handling for chroma sub8x8.
  const int is_chroma_sub8_x = plane > 0 && plane_block_width < 4;
  const int is_chroma_sub8_y = plane > 0 && plane_block_height < 4;
  if (width) {
    *width = plane_block_width + 2 * is_chroma_sub8_x;
    assert(*width >= 0);
  }
  if (height) {
    *height = plane_block_height + 2 * is_chroma_sub8_y;
    assert(*height >= 0);
  }
  if (rows_within_bounds) {
    *rows_within_bounds =
        (block_rows >> pd->subsampling_y) + 2 * is_chroma_sub8_y;
    assert(*rows_within_bounds >= 0);
  }
  if (cols_within_bounds) {
    *cols_within_bounds =
        (block_cols >> pd->subsampling_x) + 2 * is_chroma_sub8_x;
    assert(*cols_within_bounds >= 0);
  }
}